

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O0

int InputTextCallback(ImGuiInputTextCallbackData *data)

{
  undefined8 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  string *str;
  InputTextCallback_UserData *user_data;
  ImGuiInputTextCallbackData *data_local;
  
  puVar1 = (undefined8 *)data->UserData;
  if (data->EventFlag == 0x40000) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar1;
    pcVar4 = data->Buf;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (this);
    if (pcVar4 != pcVar3) {
      __assert_fail("data->Buf == str->c_str()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/misc/cpp/imgui_stdlib.cpp"
                    ,0x19,"int InputTextCallback(ImGuiInputTextCallbackData *)");
    }
    std::__cxx11::string::resize((ulong)this);
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (this);
    data->Buf = pcVar4;
  }
  else if (puVar1[1] != 0) {
    data->UserData = (void *)puVar1[2];
    iVar2 = (*(code *)puVar1[1])(data);
    return iVar2;
  }
  return 0;
}

Assistant:

static int InputTextCallback(ImGuiInputTextCallbackData* data)
{
    InputTextCallback_UserData* user_data = (InputTextCallback_UserData*)data->UserData;
    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
    {
        // Resize string callback
        // If for some reason we refuse the new length (BufTextLen) and/or capacity (BufSize) we need to set them back to what we want.
        std::string* str = user_data->Str;
        IM_ASSERT(data->Buf == str->c_str());
        str->resize(data->BufTextLen);
        data->Buf = (char*)str->c_str();
    }
    else if (user_data->ChainCallback)
    {
        // Forward to user callback, if any
        data->UserData = user_data->ChainCallbackUserData;
        return user_data->ChainCallback(data);
    }
    return 0;
}